

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

void __thiscall nvim::Nvim::ui_attach(Nvim *this,Integer width,Integer height,Dictionary *options)

{
  string local_88;
  Integer local_68;
  Integer local_60;
  variant<_cf2d41c5_> local_58;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_68 = height;
  local_60 = width;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"nvim_ui_attach","");
  NvimRPC::
  do_call<long,long,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            ((Object *)&local_58,&this->client_,&local_88,&local_60,&local_68,options);
  boost::variant<$cf2d41c5$>::destroy_content(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::ui_attach(Integer width, Integer height, const Dictionary& options) {
    client_.call("nvim_ui_attach", nullptr, width, height, options);
}